

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::MapHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  uint uVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  anon_class_24_1_2f014396_conflict2 implicitCall;
  undefined1 auVar4 [8];
  bool bVar5;
  bool bVar6;
  int iVar7;
  Var pvVar8;
  JavascriptArray *pJVar9;
  JavascriptArray *pJVar10;
  JavascriptCopyOnAccessNativeIntArray *this;
  JavascriptMethod p_Var11;
  uint64 uVar12;
  uint64 uVar13;
  undefined4 *puVar14;
  TypedArrayBase *pTVar15;
  undefined4 extraout_var;
  char16_t *varName;
  double dVar16;
  uint32 index;
  TypedArrayBase *pTVar17;
  ulong uVar18;
  undefined1 auStack_c0 [8];
  Var element;
  ScriptContext *local_b0;
  JavascriptArray *local_a8;
  TypedArrayBase *local_a0;
  RecyclableObject *local_98;
  double local_90;
  JavascriptArray *local_88;
  ScriptContext *local_80;
  undefined4 *local_78;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  TypedArrayBase *local_40;
  bool local_31 [8];
  bool isBuiltinArrayCtor;
  
  local_70 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_70)->noJsReentrancy;
  ((ThreadContext *)local_70)->noJsReentrancy = true;
  local_88 = pArr;
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,pArr);
  local_31[0] = true;
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00b99c70:
    varName = L"[TypedArray].prototype.map";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.map";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
  }
  pvVar8 = Arguments::operator[](args,1);
  bVar5 = JavascriptConversion::IsCallable(pvVar8);
  if (!bVar5) goto LAB_00b99c70;
  pvVar8 = Arguments::operator[](args,1);
  jsReentLock._24_8_ = VarTo<Js::RecyclableObject>(pvVar8);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    local_98 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    local_98 = (RecyclableObject *)Arguments::operator[](args,2);
  }
  if (local_88 == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    if (bVar5) {
      local_40 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
LAB_00b9948e:
      local_40 = (TypedArrayBase *)0x0;
    }
    *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pJVar9 = (JavascriptArray *)
             ArraySpeciesCreate<unsigned_int>
                       (obj,length,scriptContext,(bool *)0x0,(bool *)0x0,local_31);
  }
  else {
    if (typedArrayBase == (TypedArrayBase *)0x0) goto LAB_00b9948e;
    pvVar8 = Arguments::operator[](args,0);
    pJVar9 = (JavascriptArray *)TypedArrayBase::GetDefaultConstructor(pvVar8,scriptContext);
    *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pJVar10 = (JavascriptArray *)
              JavascriptOperators::SpeciesConstructor
                        ((RecyclableObject *)typedArrayBase,(JavascriptFunction *)pJVar9,
                         scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)local_70);
    *(bool *)((long)local_70 + 0x108) = true;
    local_31[0] = false;
    bVar5 = JavascriptOperators::IsConstructor((RecyclableObject *)pJVar10);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x25cd,"(JavascriptOperators::IsConstructor(constructor))",
                                  "JavascriptOperators::IsConstructor(constructor)");
      if (!bVar5) goto LAB_00b99d5a;
      *puVar14 = 0;
    }
    *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pTVar2 = scriptContext->threadContext;
    auStack_c0 = (undefined1  [8])pJVar10;
    element._0_4_ = length;
    local_b0 = scriptContext;
    if (pJVar10 == pJVar9) {
      bVar5 = pTVar2->reentrancySafeOrHandled;
      pTVar2->reentrancySafeOrHandled = true;
      pvVar8 = anon_func::anon_class_24_1_2f014396::
               anon_class_24_3_af332ec1_for_newObjectCreationFunction::operator()
                         ((anon_class_24_3_af332ec1_for_newObjectCreationFunction *)auStack_c0);
      pTVar2->reentrancySafeOrHandled = bVar5;
    }
    else {
      implicitCall.newObjectCreationFunction._12_4_ = element._4_4_;
      implicitCall.newObjectCreationFunction.length = length;
      implicitCall.newObjectCreationFunction.constructor = (RecyclableObject *)pJVar10;
      implicitCall.newObjectCreationFunction.scriptContext = scriptContext;
      pvVar8 = ThreadContext::
               ExecuteImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime___Language_JavascriptOperators_inl:168:95)>
                         (pTVar2,(RecyclableObject *)pJVar10,ImplicitCall_Accessor,implicitCall);
    }
    pJVar9 = (JavascriptArray *)VarTo<Js::RecyclableObject>(pvVar8);
    JsReentLock::MutateArrayObject((JsReentLock *)local_70);
    local_40 = typedArrayBase;
  }
  *(bool *)((long)local_70 + 0x108) = true;
  if (pJVar9 == (JavascriptArray *)0x0) {
    pJVar9 = JavascriptLibrary::CreateArray
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,length);
    pJVar10 = pJVar9;
    if ((pJVar9->head).ptr == EmptySegment) {
      AllocateHead<void*>(pJVar9);
    }
  }
  else {
    bVar5 = IsNonES5Array(pJVar9);
    if ((bVar5) &&
       (pJVar10 = UnsafeVarTo<Js::JavascriptArray>(pJVar9), pJVar10 != (JavascriptArray *)0x0)) {
      bVar5 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar10);
      if ((bVar5) &&
         (this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar10),
         this != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
      }
      JsReentLock::setSecondObjectForMutation((JsReentLock *)local_70,pJVar10);
    }
    else {
      pJVar10 = (JavascriptArray *)0x0;
    }
  }
  auStack_c0 = (undefined1  [8])0x0;
  local_a8 = pJVar10;
  if (local_88 == (JavascriptArray *)0x0) {
LAB_00b998af:
    if (local_40 == (TypedArrayBase *)0x0) {
      *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pJVar9 = (JavascriptArray *)
               MapObjectHelper<unsigned_int>
                         (obj,length,0,(RecyclableObject *)pJVar9,pJVar10,local_31[0],
                          (RecyclableObject *)jsReentLock._24_8_,local_98,scriptContext);
      goto LAB_00b99c44;
    }
    bVar5 = VarIsCorrectType<Js::TypedArrayBase>(local_40);
    if (!bVar5) {
      bVar5 = VarIsCorrectType<Js::TypedArrayBase>(local_40);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2632,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (!bVar5) goto LAB_00b99d5a;
        *puVar14 = 0;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
    bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)pJVar9);
    if (bVar5) {
      local_80 = scriptContext;
      pTVar15 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)pJVar9);
    }
    else {
      pTVar15 = (TypedArrayBase *)0x0;
      local_80 = scriptContext;
    }
    if (pJVar10 == (JavascriptArray *)0x0 && pTVar15 == (TypedArrayBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2639,"(newArr != nullptr)","newArr != nullptr");
      if (bVar5) {
        *puVar14 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
LAB_00b99d5a:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    uVar1 = (local_40->super_ArrayBufferParent).super_ArrayObject.length;
    if (uVar1 < length) {
      length = uVar1;
    }
    if (length != 0) {
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      local_90 = (double)(ulong)length;
      dVar16 = 0.0;
      local_a0 = pTVar15;
      do {
        iVar7 = (*(local_40->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(local_40,(ulong)dVar16 & 0xffffffff);
        auStack_c0 = (undefined1  [8])CONCAT44(extraout_var,iVar7);
        *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar2 = local_80->threadContext;
        bVar5 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
        if (local_80->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
        CheckIsExecutable((RecyclableObject *)jsReentLock._24_8_,p_Var11);
        p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
        local_88 = (JavascriptArray *)auStack_c0;
        if (SUB84(dVar16,0) < 0) {
          local_78 = (undefined4 *)(double)((ulong)dVar16 & 0xffffffff);
          uVar12 = NumberUtilities::ToSpecial((double)local_78);
          bVar6 = NumberUtilities::IsNan((double)local_78);
          if (((bVar6) &&
              (uVar13 = NumberUtilities::ToSpecial((double)local_78), uVar13 != 0xfff8000000000000))
             && (uVar13 = NumberUtilities::ToSpecial((double)local_78), uVar13 != 0x7ff8000000000000
                )) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar14 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar6) goto LAB_00b99d5a;
            *puVar14 = 0;
          }
          uVar18 = uVar12 ^ 0xfffc000000000000;
        }
        else {
          uVar18 = (long)dVar16 + 0x1000000000000;
        }
        pvVar8 = (*p_Var11)((RecyclableObject *)jsReentLock._24_8_,(CallInfo)jsReentLock._24_8_,
                            0x2000004,0,0,0,0,0x2000004,local_98,local_88,uVar18,obj);
        pTVar2->reentrancySafeOrHandled = bVar5;
        JsReentLock::MutateArrayObject((JsReentLock *)local_70);
        *(bool *)((long)local_70 + 0x108) = true;
        if (local_a0 == (TypedArrayBase *)0x0) {
          (*(local_a8->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (local_a8,(ulong)dVar16 & 0xffffffff,pvVar8,0);
        }
        else {
          *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          (*(local_a0->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x70])(local_a0,(ulong)dVar16 & 0xffffffff,pvVar8);
          JsReentLock::MutateArrayObject((JsReentLock *)local_70);
          *(bool *)((long)local_70 + 0x108) = true;
        }
        dVar16 = (double)((long)dVar16 + 1);
      } while (local_90 != dVar16);
    }
  }
  else {
    bVar5 = IsNonES5Array(obj);
    if (!bVar5) {
      bVar5 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2602,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar5) goto LAB_00b99d5a;
        *puVar14 = 0;
      }
      goto LAB_00b998af;
    }
    local_80 = scriptContext;
    if (length != 0) {
      local_a0 = (TypedArrayBase *)(ulong)length;
      local_78 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      pTVar15 = (TypedArrayBase *)0x0;
      do {
        *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        index = (uint32)pTVar15;
        iVar7 = (*(local_88->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x71])(local_88,(ulong)pTVar15 & 0xffffffff,auStack_c0);
        JsReentLock::MutateArrayObject((JsReentLock *)local_70);
        *(bool *)((long)local_70 + 0x108) = true;
        if (iVar7 != 0) {
          *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          pTVar2 = local_80->threadContext;
          bVar5 = pTVar2->reentrancySafeOrHandled;
          pTVar2->reentrancySafeOrHandled = true;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
          if (local_80->threadContext->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
          CheckIsExecutable((RecyclableObject *)jsReentLock._24_8_,p_Var11);
          p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
          auVar4 = auStack_c0;
          if ((int)index < 0) {
            local_90 = (double)((ulong)pTVar15 & 0xffffffff);
            uVar12 = NumberUtilities::ToSpecial(local_90);
            bVar6 = NumberUtilities::IsNan(local_90);
            if (((bVar6) &&
                (uVar13 = NumberUtilities::ToSpecial(local_90), uVar13 != 0xfff8000000000000)) &&
               (uVar13 = NumberUtilities::ToSpecial(local_90), uVar13 != 0x7ff8000000000000)) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_78 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                          ,0xa2,
                                          "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                          ,"We should only produce a NaN with this value");
              if (!bVar6) goto LAB_00b99d5a;
              *local_78 = 0;
            }
            pTVar17 = (TypedArrayBase *)(uVar12 ^ 0xfffc000000000000);
          }
          else {
            pTVar17 = pTVar15 + 0x40000000000;
          }
          pvVar8 = (*p_Var11)((RecyclableObject *)jsReentLock._24_8_,(CallInfo)jsReentLock._24_8_,
                              0x2000004,0,0,0,0,0x2000004,local_98,auVar4,pTVar17,local_88);
          pTVar2->reentrancySafeOrHandled = bVar5;
          JsReentLock::MutateArrayObject((JsReentLock *)local_70);
          pJVar10 = local_a8;
          *(bool *)((long)local_70 + 0x108) = true;
          if ((local_a8 == (JavascriptArray *)0x0) || (local_31[0] != true)) {
            *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            iVar7 = (*(pJVar9->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x29])
                              (pJVar9,(ulong)pTVar15 & 0xffffffff,pvVar8,4);
            ThrowErrorOnFailure(iVar7,local_80,index);
            JsReentLock::MutateArrayObject((JsReentLock *)local_70);
            *(bool *)((long)local_70 + 0x108) = true;
          }
          else {
            DirectSetItemAt<void*>(local_a8,index,pvVar8);
          }
          bVar5 = IsNonES5Array(obj);
          if (!bVar5) {
            bVar5 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
            if (!bVar5) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_78 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x262b,"(VarIs<ES5Array>(obj))",
                                          "The array should have been converted to an ES5Array");
              if (!bVar5) goto LAB_00b99d5a;
              *local_78 = 0;
            }
            *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            pJVar9 = (JavascriptArray *)
                     MapObjectHelper<unsigned_int>
                               (obj,(uint)local_a0,index + 1,(RecyclableObject *)pJVar9,pJVar10,
                                local_31[0],(RecyclableObject *)jsReentLock._24_8_,local_98,local_80
                               );
            goto LAB_00b99c44;
          }
        }
        pTVar15 = (TypedArrayBase *)
                  ((long)&(pTVar15->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                          super_RecyclableObject.super_FinalizableObject.
                          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1);
      } while (local_a0 != pTVar15);
    }
  }
  bVar5 = IsNonES5Array(pJVar9);
  if (bVar5) {
    (*(local_a8->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
LAB_00b99c44:
  *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pJVar9;
}

Assistant:

Var JavascriptArray::MapHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        RecyclableObject* newObj = nullptr;
        JavascriptArray* newArr = nullptr;
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;
        bool isBuiltinArrayCtor = true;

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (isTypedArrayEntryPoint)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.map"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.map"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.map and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        // If the entry point is %TypedArray%.prototype.map or the source object is an Array exotic object we should try to load the constructor property
        // and use it to construct the return object.
        if (isTypedArrayEntryPoint)
        {
            JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(args[0], scriptContext);
            JS_REENTRANT(jsReentLock,
                RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(typedArrayBase, defaultConstructor, scriptContext));

            isBuiltinArrayCtor = false;

            AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

            bool isDefaultConstructor = constructor == defaultConstructor;
            JS_REENTRANT(jsReentLock,
                newObj = VarTo<RecyclableObject>(
                    JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
                    {
                        Js::Var constructorArgs[] = {constructor, JavascriptNumber::ToVar(length, scriptContext) };
                        Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                        return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), (uint32)length, scriptContext);
                    }));
            )
        }
        // skip the typed array and "pure" array case, we still need to handle special arrays like es5array, remote array, and proxy of array.
        else
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, newObj = ArraySpeciesCreate(obj, length, scriptContext, nullptr, nullptr, &isBuiltinArrayCtor));
        }

        if (newObj == nullptr)
        {
            if (length > UINT_MAX)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
            }
            newArr = scriptContext->GetLibrary()->CreateArray(static_cast<uint32>(length));
            newArr->EnsureHead<Var>();
            newObj = newArr;
        }
        else
        {
            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
                SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, newArr);
            }
        }

        Var element = nullptr;
        Var mappedValue = nullptr;
        CallInfo callBackFnInfo = CallInfo(CallFlags_Value, 4);

        // We at least have to have newObj as a valid object
        Assert(newObj);

        // The ArraySpeciesCreate call above could have converted the source array into an ES5Array. If this happens
        // we will process the array elements like an ES5Array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr != nullptr)
        {
            // If source is a JavascriptArray, newObj may or may not be an array based on what was in source's constructor property
            Assert(length <= UINT_MAX);
            for (uint32 k = 0; k < (uint32)length; k++)
            {
                JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(k, &element));
                if (!gotItem)
                {
                    continue;
                }

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                pArr);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                // If newArr is a valid pointer, then we constructed an array to return. Otherwise we need to do generic object operations
                if (newArr && isBuiltinArrayCtor)
                {
                    newArr->DirectSetItemAt(k, mappedValue);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, k, mappedValue), scriptContext, k));
                }

                // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
                // we will process the rest of the array elements like an ES5Array.
                if (!JavascriptArray::IsNonES5Array(obj))
                {
                    AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::MapObjectHelper<T>(obj, length, k + 1, newObj, newArr, isBuiltinArrayCtor, callBackFn, thisArg, scriptContext));
                }
            }
        }
        else if (typedArrayBase != nullptr)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));

            // Source is a TypedArray, we may have tried to call a constructor, but newObj may not be a TypedArray (or an array either)
            TypedArrayBase* newTypedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);

            if (!newTypedArray)
            {
                AssertAndFailFast(newArr != nullptr);
            }

            Assert(length <= UINT_MAX);
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (uint32 k = 0; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem(k);
                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                // If newObj is a TypedArray, set the mappedValue directly, otherwise it should be an array, set that item to that array
                if (newTypedArray)
                {
                    JS_REENTRANT(jsReentLock, newTypedArray->DirectSetItem(k, mappedValue));
                }
                else
                {
                    newArr->SetItem(k, mappedValue, PropertyOperation_None);
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::MapObjectHelper<T>(obj, length, 0u, newObj, newArr, isBuiltinArrayCtor, callBackFn, thisArg, scriptContext));
        }

#ifdef VALIDATE_ARRAY
        if (JavascriptArray::IsNonES5Array(newObj))
        {
            newArr->ValidateArray();
        }
#endif

        return newObj;
    }